

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromBundle(CollationLoader *this,UErrorCode *errorCode)

{
  char *__dest;
  uint uVar1;
  int iVar2;
  UResourceBundle *resB;
  CollationCacheEntry *pCVar3;
  UChar *us;
  char *pcVar4;
  int32_t length;
  UErrorCode internalErrorCode;
  LocalUResourceBundlePointer def;
  int local_38;
  UErrorCode local_34;
  LocalUResourceBundlePointer local_30;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar4 = "collations";
    resB = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
    this->collations = resB;
    if (*errorCode == U_MISSING_RESOURCE_ERROR) {
      *errorCode = U_USING_DEFAULT_WARNING;
      pCVar3 = makeCacheEntryFromRoot(this,(Locale *)pcVar4,errorCode);
      return pCVar3;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      local_34 = U_ZERO_ERROR;
      local_30.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKeyWithFallback_63(resB,"default",(UResourceBundle *)0x0,&local_34);
      us = ures_getString_63((UResourceBundle *)local_30.super_LocalPointerBase<UResourceBundle>.ptr
                             ,&local_38,&local_34);
      pcVar4 = this->defaultType;
      if (local_38 - 1U < 0xf && local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
        u_UCharsToChars_63(us,pcVar4,local_38 + 1);
      }
      else {
        builtin_strncpy(pcVar4,"standard",9);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_30);
      __dest = this->type;
      if (this->type[0] != '\0') {
        iVar2 = strcmp(__dest,pcVar4);
        if (iVar2 == 0) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 2;
        }
        if (*(int *)(this->type + 3) == 0x686372 && *(int *)__dest == 0x72616573) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 1;
        }
        if (this->type[8] == '\0' && *(long *)__dest == 0x647261646e617473) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 4;
        }
        pCVar3 = loadFromCollations(this,errorCode);
        return pCVar3;
      }
      strcpy(__dest,pcVar4);
      uVar1 = this->typesTried;
      this->typesTried = uVar1 | 2;
      if (*(int *)(this->type + 3) == 0x686372 && *(int *)this->type == 0x72616573) {
        this->typesTried = uVar1 | 3;
      }
      if (this->type[8] == '\0' && *(long *)__dest == 0x647261646e617473) {
        *(byte *)&this->typesTried = (byte)this->typesTried | 4;
      }
      Locale::setKeywordValue(&this->locale,"collation",__dest,errorCode);
      pCVar3 = getCacheEntry(this,errorCode);
      return pCVar3;
    }
  }
  return (CollationCacheEntry *)0x0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}